

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::iterate(InvarianceTest *this)

{
  ostringstream *poVar1;
  ShaderProgram *pSVar2;
  RenderContext *pRVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  TextureFormat *pTVar11;
  long lVar12;
  char *pcVar13;
  qpTestResult testResult;
  void *data;
  int iVar14;
  char *pcVar15;
  bool bVar16;
  Surface resultSurface;
  Vec4 color;
  Surface local_210;
  TextureFormat local_1f8;
  undefined8 uStack_1f0;
  long local_1e0;
  TextureFormat local_1d8;
  TextureFormat TStack_1d0;
  TextureFormat local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar6);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar10->m_depthBits;
  tcu::Surface::Surface(&local_210,this->m_renderSize,this->m_renderSize);
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  (**(code **)(lVar12 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar12 + 0x40))(0x8892,this->m_arrayBuf);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                  ,0x10c);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Testing position invariance.",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar14 = 1;
  bVar5 = true;
  local_1e0 = lVar12;
  do {
    pSVar2 = (&this->m_shader0)[(byte)~bVar5];
    uVar8 = (**(code **)(lVar12 + 0x780))((pSVar2->m_program).m_program,"a_input");
    uVar9 = (**(code **)(lVar12 + 0xb48))((pSVar2->m_program).m_program,"u_color");
    local_1f8.order = 0x3f800000;
    local_1f8.type = SNORM_INT8;
    uStack_1f0 = 0x3f80000000000000;
    local_1c8.order = R;
    local_1c8.type = 0x3f800000;
    uStack_1c0 = 0x3f80000000000000;
    pTVar11 = &local_1c8;
    if (bVar5) {
      pTVar11 = &local_1f8;
    }
    local_1d8 = *pTVar11;
    TStack_1d0 = pTVar11[1];
    pcVar13 = "green";
    if (bVar5) {
      pcVar13 = "red - purple";
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Drawing position test pattern using shader ",0x2b);
    std::ostream::operator<<(poVar1,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Primitive color: ",0x13)
    ;
    lVar12 = 5;
    if (bVar5 != false) {
      lVar12 = 0xc;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    lVar12 = local_1e0;
    (**(code **)(local_1e0 + 0x1680))((pSVar2->m_program).m_program);
    (**(code **)(lVar12 + 0x15a8))(uVar9,1,&local_1d8);
    (**(code **)(lVar12 + 0x610))(uVar8);
    (**(code **)(lVar12 + 0x19f0))(uVar8,4,0x1406,0,0x10,0);
    (**(code **)(lVar12 + 0x538))(4,0,this->m_verticesInPattern);
    (**(code **)(lVar12 + 0x518))(uVar8);
    dVar7 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar7,"draw pass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                    ,0x123);
    iVar14 = 2;
    bVar16 = bVar5 != false;
    bVar5 = false;
  } while (bVar16);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1f8.order = RGBA;
  local_1f8.type = UNORM_INT8;
  data = (void *)local_210.m_pixels.m_cap;
  if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
    data = local_210.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1f8,local_210.m_width,local_210.m_height,1,data);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying output. Expecting only green or background colored pixels.",0x44);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  bVar5 = checkImage(this,&local_210);
  if (iVar6 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Depth buffer not available, skipping z-test.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (!bVar5) goto LAB_01278d45;
  }
  else {
    (**(code **)(lVar12 + 0x1d0))(0x3f800000);
    (**(code **)(lVar12 + 0x188))(0x4100);
    (**(code **)(lVar12 + 0x5e0))(0xb71);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Testing position invariance with z-test. Enabling GL_DEPTH_TEST.",
               0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    iVar6 = 1;
    bVar4 = 1;
    do {
      pSVar2 = (&this->m_shader0)[(byte)~bVar4 & 1];
      uVar8 = (**(code **)(lVar12 + 0x780))((pSVar2->m_program).m_program,"a_input");
      uVar9 = (**(code **)(lVar12 + 0xb48))((pSVar2->m_program).m_program,"u_color");
      local_1f8.order = 0x3f800000;
      local_1f8.type = SNORM_INT8;
      uStack_1f0 = 0x3f80000000000000;
      bVar16 = bVar4 != 0;
      pTVar11 = &local_1c8;
      if (bVar16) {
        pTVar11 = &local_1f8;
      }
      local_1c8.order = R;
      local_1c8.type = 0x3f800000;
      uStack_1c0 = 0x3f80000000000000;
      pcVar13 = "GL_EQUAL";
      if (bVar16) {
        pcVar13 = "GL_ALWAYS";
      }
      local_1d8 = *pTVar11;
      TStack_1d0 = pTVar11[1];
      pcVar15 = "green";
      if (bVar16) {
        pcVar15 = "red - purple";
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Drawing Z-test pattern using shader ",0x24);
      std::ostream::operator<<(poVar1,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Primitive color: ",0x13);
      lVar12 = 5;
      if (bVar4 != 0) {
        lVar12 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar15,lVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". DepthFunc: ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,(ulong)bVar4 | 8)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      lVar12 = local_1e0;
      (**(code **)(local_1e0 + 0x1680))((pSVar2->m_program).m_program);
      (**(code **)(lVar12 + 0x15a8))(uVar9,1,&local_1d8);
      (**(code **)(lVar12 + 0x4a0))((uint)bVar4 * 5 + 0x202);
      (**(code **)(lVar12 + 0x610))(uVar8);
      (**(code **)(lVar12 + 0x19f0))(uVar8,4,0x1406,0,0x10,0);
      (**(code **)(lVar12 + 0x538))(4,this->m_verticesInPattern);
      (**(code **)(lVar12 + 0x518))(uVar8);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"draw pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                      ,0x150);
      iVar6 = 2;
      bVar16 = bVar4 != 0;
      bVar4 = 0;
    } while (bVar16);
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_1f8.order = RGBA;
    local_1f8.type = UNORM_INT8;
    if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
      local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_1f8,local_210.m_width,local_210.m_height,1,
               (void *)local_210.m_pixels.m_cap);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1b0);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Verifying output. Expecting only green or background colored pixels.",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    bVar16 = checkImage(this,&local_210);
    if (!bVar5 || !bVar16) {
LAB_01278d45:
      pcVar13 = "Detected variance between two invariant values";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_01278d51;
    }
  }
  pcVar13 = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_01278d51:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar13);
  tcu::Surface::~Surface(&local_210);
  return STOP;
}

Assistant:

InvarianceTest::IterateResult InvarianceTest::iterate (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				depthBufferExists	= m_context.getRenderTarget().getDepthBits() != 0;
	tcu::Surface			resultSurface		(m_renderSize, m_renderSize);
	bool					error				= false;

	// Prepare draw
	gl.clearColor		(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear			(GL_COLOR_BUFFER_BIT);
	gl.viewport			(0, 0, m_renderSize, m_renderSize);
	gl.bindBuffer		(GL_ARRAY_BUFFER, m_arrayBuf);
	GLU_EXPECT_NO_ERROR	(gl.getError(), "setup draw");

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance." << tcu::TestLog::EndMessage;

	// Draw position check passes
	for (int passNdx = 0; passNdx < 2; ++passNdx)
	{
		const glu::ShaderProgram&	shader		= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
		const glw::GLint			positionLoc = gl.getAttribLocation(shader.getProgram(), "a_input");
		const glw::GLint			colorLoc	= gl.getUniformLocation(shader.getProgram(), "u_color");
		const tcu::Vec4				red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		const tcu::Vec4				green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
		const tcu::Vec4				color		= (passNdx == 0) ? (red) : (green);
		const char* const			colorStr	= (passNdx == 0) ? ("red - purple") : ("green");

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing position test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << "." << tcu::TestLog::EndMessage;

		gl.useProgram				(shader.getProgram());
		gl.uniform4fv				(colorLoc, 1, color.getPtr());
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
		gl.drawArrays				(GL_TRIANGLES, 0, m_verticesInPattern);
		gl.disableVertexAttribArray	(positionLoc);
		GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
	}

	// Read result
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	// Check there are no red pixels
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
	error |= !checkImage(resultSurface);

	if (!depthBufferExists)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth buffer not available, skipping z-test." << tcu::TestLog::EndMessage;
	}
	else
	{
		// Test with Z-test
		gl.clearDepthf		(1.0f);
		gl.clear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.enable			(GL_DEPTH_TEST);

		m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance with z-test. Enabling GL_DEPTH_TEST." << tcu::TestLog::EndMessage;

		// Draw position check passes
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const glu::ShaderProgram&	shader			= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
			const glw::GLint			positionLoc		= gl.getAttribLocation(shader.getProgram(), "a_input");
			const glw::GLint			colorLoc		= gl.getUniformLocation(shader.getProgram(), "u_color");
			const tcu::Vec4				red				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
			const tcu::Vec4				green			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
			const tcu::Vec4				color			= (passNdx == 0) ? (red) : (green);
			const glw::GLenum			depthFunc		= (passNdx == 0) ? (GL_ALWAYS) : (GL_EQUAL);
			const char* const			depthFuncStr	= (passNdx == 0) ? ("GL_ALWAYS") : ("GL_EQUAL");
			const char* const			colorStr		= (passNdx == 0) ? ("red - purple") : ("green");

			m_testCtx.getLog() << tcu::TestLog::Message << "Drawing Z-test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << ". DepthFunc: " << depthFuncStr << tcu::TestLog::EndMessage;

			gl.useProgram				(shader.getProgram());
			gl.uniform4fv				(colorLoc, 1, color.getPtr());
			gl.depthFunc				(depthFunc);
			gl.enableVertexAttribArray	(positionLoc);
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
			gl.drawArrays				(GL_TRIANGLES, m_verticesInPattern, m_verticesInPattern); // !< buffer contains 2 m_verticesInPattern-sized patterns
			gl.disableVertexAttribArray	(positionLoc);
			GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
		}

		// Read result
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

		// Check there are no red pixels
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
		error |= !checkImage(resultSurface);
	}

	// Report result
	if (error)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected variance between two invariant values");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}